

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O3

QString * __thiscall
VcprojGenerator::firstExpandedOutputFileName
          (QString *__return_storage_ptr__,VcprojGenerator *this,ProString *extraCompilerName)

{
  QMakeProject *this_00;
  long in_FS_OFFSET;
  ProString firstOutput;
  QString local_128;
  QString local_108;
  QString local_f0;
  ProString local_d8;
  undefined1 local_a8 [32];
  undefined1 *local_88;
  undefined1 *puStack_80;
  QArrayDataPointer<QString> local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  local_58.ptr = (QString *)0x2ac437;
  local_58.d = (Data *)extraCompilerName;
  ProString::ProString<ProString_const&,char_const(&)[8]>
            (&local_d8,(QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&local_58);
  QMakeEvaluator::first((ProString *)local_a8,&this_00->super_QMakeEvaluator,(ProKey *)&local_d8);
  if (&(local_d8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_d8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProString::toQString(&local_f0,(ProString *)local_a8);
  firstInputFileName(&local_d8,this,extraCompilerName);
  ProString::toQString(&local_108,&local_d8);
  local_128.d.size = 0;
  local_128.d.d = (Data *)0x0;
  local_128.d.ptr = (char16_t *)0x0;
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)&local_58,0,&local_108);
  QList<QString>::end((QList<QString> *)&local_58);
  local_78.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QString *)0x0;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)&local_78,0,&local_128);
  QList<QString>::end((QList<QString> *)&local_78);
  (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
    _vptr_QMakeSourceFileInfo[0xb])(__return_storage_ptr__,this,&local_f0,&local_58,&local_78,0);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_d8.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f0.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString VcprojGenerator::firstExpandedOutputFileName(const ProString &extraCompilerName)
{
    const ProString firstOutput = project->first(ProKey(extraCompilerName + ".output"));
    return replaceExtraCompilerVariables(firstOutput.toQString(),
                                         firstInputFileName(extraCompilerName).toQString(),
                                         QString(), NoShell);
}